

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O2

void set_socket_timeout(int socket_fd,timeval *timeout,Direction direction)

{
  int iVar1;
  
  iVar1 = setsockopt(socket_fd,1,(direction == SEND) + 0x14,timeout,0x10);
  if (iVar1 != -1) {
    return;
  }
  throw("Error setting blocking timeout");
}

Assistant:

void set_socket_timeout(int socket_fd, timeval* timeout, Direction direction) {
	// clang-format off
	int return_code = setsockopt(
		socket_fd,
		SOL_SOCKET,
		(direction == SEND) ? SO_SNDTIMEO : SO_RCVTIMEO,
		timeout,
		sizeof *timeout
	);
	// clang-format on

	if (return_code == -1) {
		throw("Error setting blocking timeout");
	}
}